

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindAggregateState
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer pcVar1;
  ScalarFunction *pSVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  reference pvVar6;
  pointer pEVar7;
  LogicalType *this_00;
  pointer pEVar8;
  aggregate_state_t *paVar9;
  Catalog *this_01;
  idx_t offset;
  BoundConstantExpression *this_02;
  InternalException *pIVar10;
  BinderException *pBVar11;
  pointer pLVar12;
  LogicalType *pLVar13;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *other;
  LogicalType *arg_type;
  pointer pLVar14;
  aggregate_state_t state_type;
  optional_idx best_function;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  args;
  FunctionBinder function_binder;
  AggregateFunction bound_aggr;
  ErrorData error;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_408;
  ClientContext *local_400;
  pointer local_3f8;
  string local_3f0;
  LogicalType local_3d0;
  vector<duckdb::LogicalType,_true> local_3b8;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_3a0;
  ScalarFunction *local_398;
  optional_idx local_390;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_388;
  Value local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  FunctionBinder local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 local_298 [240];
  bind_aggregate_function_t local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  undefined1 local_168 [160];
  LogicalType local_c8;
  undefined1 local_b0 [128];
  
  local_400 = context;
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  this_00 = &pEVar7->return_type;
  pLVar14 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start;
  pLVar12 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_3f8 = pEVar7;
  local_398 = bound_function;
  if (pLVar14 != pLVar12) {
    pLVar13 = &pEVar7->return_type;
    do {
      if (pLVar14 != this_00) {
        pLVar14->id_ = (pEVar7->return_type).id_;
        pLVar14->physical_type_ = (pEVar7->return_type).physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&pLVar14->type_info_,&pLVar13->type_info_);
        pEVar7 = local_3f8;
      }
      pLVar14 = pLVar14 + 1;
    } while (pLVar14 != pLVar12);
  }
  if (this_00->id_ != AGGREGATE_STATE) {
    pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
    local_298._0_8_ = local_298 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,"Can only FINALIZE aggregate state, not %s","");
    LogicalType::ToString_abi_cxx11_((string *)(local_168 + 0x80),this_00);
    BinderException::BinderException<std::__cxx11::string>
              (pBVar11,(string *)local_298,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_168 + 0x80));
    __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((long)(arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x10) {
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    bVar4 = LogicalType::operator==(&pEVar7->return_type,&pEVar8->return_type);
    if (!bVar4) {
      pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,1);
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar6);
      if ((pEVar7->return_type).id_ != BLOB) {
        pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
        local_298._0_8_ = local_298 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_298,
                   "Cannot COMBINE aggregate states from different functions, %s <> %s","");
        pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,0);
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar6);
        LogicalType::ToString_abi_cxx11_((string *)(local_168 + 0x60),&pEVar7->return_type);
        pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,1);
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar6);
        LogicalType::ToString_abi_cxx11_((string *)(local_168 + 0x40),&pEVar7->return_type);
        BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                  (pBVar11,(string *)local_298,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_168 + 0x60),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_168 + 0x40));
        __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  paVar9 = AggregateStateType::GetStateType(this_00);
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  pcVar1 = (paVar9->function_name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f0,pcVar1,pcVar1 + (paVar9->function_name)._M_string_length);
  LogicalType::LogicalType(&local_3d0,&paVar9->return_type);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3b8,
             &(paVar9->bound_argument_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  this_01 = Catalog::GetSystemCatalog(local_400);
  pcVar1 = local_298 + 0x10;
  local_298._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"main","");
  local_b0._0_8_ =
       Catalog::GetEntry<duckdb::AggregateFunctionCatalogEntry>
                 (this_01,local_400,(string *)local_298,&local_3f0,THROW_EXCEPTION,
                  (QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true> *)local_b0);
  uVar3 = local_b0._0_8_;
  if ((pointer)local_298._0_8_ != pcVar1) {
    operator_delete((void *)local_298._0_8_);
  }
  if ((((FunctionEntry *)uVar3)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.type
      != AGGREGATE_FUNCTION_ENTRY) {
    pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
    local_298._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,"Could not find aggregate %s","");
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b8,local_3f0._M_dataplus._M_p,
               local_3f0._M_dataplus._M_p + local_3f0._M_string_length);
    InternalException::InternalException<std::__cxx11::string>
              (pIVar10,(string *)local_298,&local_2b8);
    __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ErrorData::ErrorData((ErrorData *)local_b0);
  FunctionBinder::FunctionBinder(&local_2c8,local_400);
  local_390 = FunctionBinder::BindFunction
                        (&local_2c8,
                         &(((FunctionEntry *)uVar3)->super_StandardEntry).super_InCatalogEntry.
                          super_CatalogEntry.name,(AggregateFunctionSet *)(uVar3 + 0x158),&local_3b8
                         ,(ErrorData *)local_b0);
  if (local_390.index == 0xffffffffffffffff) {
    pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
    local_298._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,"Could not re-bind exported aggregate %s: %s","");
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e8,local_3f0._M_dataplus._M_p,
               local_3f0._M_dataplus._M_p + local_3f0._M_string_length);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_308,local_b0._40_8_,(pointer)(local_b0._40_8_ + local_b0._48_8_));
    InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
              (pIVar10,(string *)local_298,&local_2e8,&local_308);
    __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  offset = optional_idx::GetIndex(&local_390);
  FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
            ((AggregateFunction *)local_298,
             (FunctionSet<duckdb::AggregateFunction> *)(uVar3 + 0x158),offset);
  if (local_1a8 != (bind_aggregate_function_t)0x0) {
    local_388.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_388.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_388.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3a0._M_head_impl = (FunctionData *)this;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::reserve(&local_388,
              ((long)local_3b8.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_3b8.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    pLVar14 = local_3b8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (local_3b8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_3b8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pLVar12 = local_3b8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        LogicalType::LogicalType(&local_c8,pLVar12);
        Value::Value((Value *)local_168,&local_c8);
        this_02 = (BoundConstantExpression *)operator_new(0x98);
        Value::Value(&local_368,(Value *)local_168);
        BoundConstantExpression::BoundConstantExpression(this_02,&local_368);
        Value::~Value(&local_368);
        local_408._M_head_impl = (Expression *)this_02;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_388,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_408);
        if ((BoundConstantExpression *)local_408._M_head_impl != (BoundConstantExpression *)0x0) {
          (*(((Expression *)&(local_408._M_head_impl)->super_BaseExpression)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        local_408._M_head_impl = (Expression *)0x0;
        Value::~Value((Value *)local_168);
        LogicalType::~LogicalType(&local_c8);
        pLVar12 = pLVar12 + 1;
      } while (pLVar12 != pLVar14);
    }
    (*local_1a8)((ClientContext *)local_168,(AggregateFunction *)local_400,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_298);
    this = (duckdb *)local_3a0._M_head_impl;
    if ((element_type *)local_168._0_8_ != (element_type *)0x0) {
      pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
      local_368.type_._0_8_ =
           &local_368.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_368,
                 "Aggregate function with bind info not supported yet in aggregate state export","")
      ;
      BinderException::BinderException(pBVar11,(string *)&local_368);
      __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector(&local_388);
  }
  bVar4 = LogicalType::operator==((LogicalType *)(local_298 + 0x90),&local_3d0);
  if (!bVar4) {
LAB_01119188:
    pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
    local_368.type_._0_8_ =
         &local_368.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_368,"Type mismatch for exported aggregate %s","");
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_328,local_3f0._M_dataplus._M_p,
               local_3f0._M_dataplus._M_p + local_3f0._M_string_length);
    InternalException::InternalException<std::__cxx11::string>
              (pIVar10,(string *)&local_368,&local_328);
    __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (local_298._80_8_ - local_298._72_8_ !=
      (long)local_3b8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_3b8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start) goto LAB_01119188;
  pLVar13 = (LogicalType *)local_298._72_8_;
  pLVar14 = local_3b8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_298._72_8_ != local_298._80_8_) {
    do {
      bVar4 = LogicalType::operator==(pLVar13,pLVar14);
      pLVar13 = pLVar13 + 1;
      pLVar14 = pLVar14 + 1;
    } while (bVar4 && pLVar13 != (LogicalType *)local_298._80_8_);
    if (!bVar4) goto LAB_01119188;
  }
  pSVar2 = local_398;
  iVar5 = ::std::__cxx11::string::compare
                    ((char *)&(local_398->super_BaseScalarFunction).super_SimpleFunction.
                              super_Function.name);
  if (iVar5 == 0) {
    if ((ScalarFunction *)local_298 == pSVar2) goto LAB_011190a8;
    other = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(local_298 + 0x98);
    (pSVar2->super_BaseScalarFunction).return_type.id_ = local_298[0x90];
    (pSVar2->super_BaseScalarFunction).return_type.physical_type_ = local_298[0x91];
  }
  else {
    if (&(pSVar2->super_BaseScalarFunction).return_type == this_00) goto LAB_011190a8;
    (pSVar2->super_BaseScalarFunction).return_type.id_ = (local_3f8->return_type).id_;
    (pSVar2->super_BaseScalarFunction).return_type.physical_type_ =
         (local_3f8->return_type).physical_type_;
    other = &(local_3f8->return_type).type_info_;
  }
  shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
            (&(pSVar2->super_BaseScalarFunction).return_type.type_info_,other);
LAB_011190a8:
  local_168._0_8_ = (*(code *)local_298._176_8_)();
  make_uniq<duckdb::ExportAggregateBindData,duckdb::AggregateFunction&,unsigned_long>
            ((duckdb *)&local_368,(AggregateFunction *)local_298,(unsigned_long *)local_168);
  *(undefined8 *)this = local_368.type_._0_8_;
  local_298._0_8_ = &PTR__AggregateFunction_0243ae10;
  if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_298);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_b0 + 0x48));
  if ((undefined1 *)local_b0._40_8_ != local_b0 + 0x38) {
    operator_delete((void *)local_b0._40_8_);
  }
  if ((undefined1 *)local_b0._8_8_ != local_b0 + 0x18) {
    operator_delete((void *)local_b0._8_8_);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3b8);
  LogicalType::~LogicalType(&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> BindAggregateState(ClientContext &context, ScalarFunction &bound_function,
                                                   vector<unique_ptr<Expression>> &arguments) {

	// grab the aggregate type and bind the aggregate again

	// the aggregate name and types are in the logical type of the aggregate state, make sure its sane
	auto &arg_return_type = arguments[0]->return_type;
	for (auto &arg_type : bound_function.arguments) {
		arg_type = arg_return_type;
	}

	if (arg_return_type.id() != LogicalTypeId::AGGREGATE_STATE) {
		throw BinderException("Can only FINALIZE aggregate state, not %s", arg_return_type.ToString());
	}
	// combine
	if (arguments.size() == 2 && arguments[0]->return_type != arguments[1]->return_type &&
	    arguments[1]->return_type.id() != LogicalTypeId::BLOB) {
		throw BinderException("Cannot COMBINE aggregate states from different functions, %s <> %s",
		                      arguments[0]->return_type.ToString(), arguments[1]->return_type.ToString());
	}

	// following error states are only reachable when someone messes up creating the state_type
	// which is impossible from SQL

	auto state_type = AggregateStateType::GetStateType(arg_return_type);

	// now we can look up the function in the catalog again and bind it
	auto &func = Catalog::GetSystemCatalog(context).GetEntry<AggregateFunctionCatalogEntry>(context, DEFAULT_SCHEMA,
	                                                                                        state_type.function_name);
	if (func.type != CatalogType::AGGREGATE_FUNCTION_ENTRY) {
		throw InternalException("Could not find aggregate %s", state_type.function_name);
	}
	auto &aggr = func.Cast<AggregateFunctionCatalogEntry>();

	ErrorData error;

	FunctionBinder function_binder(context);
	auto best_function =
	    function_binder.BindFunction(aggr.name, aggr.functions, state_type.bound_argument_types, error);
	if (!best_function.IsValid()) {
		throw InternalException("Could not re-bind exported aggregate %s: %s", state_type.function_name,
		                        error.Message());
	}
	auto bound_aggr = aggr.functions.GetFunctionByOffset(best_function.GetIndex());
	if (bound_aggr.bind) {
		// FIXME: this is really hacky
		// but the aggregate state export needs a rework around how it handles more complex aggregates anyway
		vector<unique_ptr<Expression>> args;
		args.reserve(state_type.bound_argument_types.size());
		for (auto &arg_type : state_type.bound_argument_types) {
			args.push_back(make_uniq<BoundConstantExpression>(Value(arg_type)));
		}
		auto bind_info = bound_aggr.bind(context, bound_aggr, args);
		if (bind_info) {
			throw BinderException("Aggregate function with bind info not supported yet in aggregate state export");
		}
	}

	if (bound_aggr.return_type != state_type.return_type || bound_aggr.arguments != state_type.bound_argument_types) {
		throw InternalException("Type mismatch for exported aggregate %s", state_type.function_name);
	}

	if (bound_function.name == "finalize") {
		bound_function.return_type = bound_aggr.return_type;
	} else {
		D_ASSERT(bound_function.name == "combine");
		bound_function.return_type = arg_return_type;
	}

	return make_uniq<ExportAggregateBindData>(bound_aggr, bound_aggr.state_size(bound_aggr));
}